

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPIToolchains.cxx
# Opt level: O2

void __thiscall
anon_unknown.dwarf_15fdc52::Toolchains::DumpToolchainVariable
          (Toolchains *this,cmMakefile *mf,Value *object,string *lang,ToolchainVariable *variable)

{
  cmValue cVar1;
  Value *pVVar2;
  pointer value;
  cmList values;
  Value jsonArray;
  string variableName;
  Value local_58;
  
  cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string_const&>
            (&variableName,(char (*) [7])0x6cf18b,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)object,
             (char (*) [2])0x6fd3dc,lang + 1);
  if (*(char *)&lang[2]._M_dataplus._M_p == '\x01') {
    cVar1 = cmMakefile::GetDefinition((cmMakefile *)this,&variableName);
    if (cVar1.Value != (string *)0x0) {
      cmList::cmList(&values,cVar1,Yes,No);
      Json::Value::Value(&jsonArray,arrayValue);
      for (value = values.Values.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          value != values.Values.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish; value = value + 1) {
        Json::Value::Value(&local_58,value);
        Json::Value::append(&jsonArray,&local_58);
        Json::Value::~Value(&local_58);
      }
      pVVar2 = Json::Value::operator[]((Value *)mf,lang);
      Json::Value::operator=(pVVar2,&jsonArray);
      Json::Value::~Value(&jsonArray);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&values.Values);
    }
  }
  else {
    cVar1 = cmMakefile::GetDefinition((cmMakefile *)this,&variableName);
    if (cVar1.Value != (string *)0x0) {
      Json::Value::Value(&jsonArray,cVar1.Value);
      pVVar2 = Json::Value::operator[]((Value *)mf,lang);
      Json::Value::operator=(pVVar2,&jsonArray);
      Json::Value::~Value(&jsonArray);
    }
  }
  std::__cxx11::string::~string((string *)&variableName);
  return;
}

Assistant:

void Toolchains::DumpToolchainVariable(cmMakefile const* mf,
                                       Json::Value& object,
                                       std::string const& lang,
                                       ToolchainVariable const& variable)
{
  std::string const variableName =
    cmStrCat("CMAKE_", lang, "_", variable.VariableSuffix);

  if (variable.IsList) {
    cmValue data = mf->GetDefinition(variableName);
    if (data) {
      cmList values(data);
      Json::Value jsonArray = Json::arrayValue;
      for (auto const& value : values) {
        jsonArray.append(value);
      }
      object[variable.ObjectKey] = jsonArray;
    }
  } else {
    cmValue def = mf->GetDefinition(variableName);
    if (def) {
      object[variable.ObjectKey] = *def;
    }
  }
}